

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.cc
# Opt level: O3

void __thiscall
dynet::FastLSTMBuilder::new_graph_impl(FastLSTMBuilder *this,ComputationGraph *cg,bool update)

{
  pointer pvVar1;
  Parameter p;
  undefined7 in_register_00000011;
  ulong uVar2;
  long lVar3;
  initializer_list<dynet::Expression> __l;
  Expression EVar4;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> vars;
  allocator_type local_19d;
  undefined4 local_19c;
  undefined8 local_198;
  ComputationGraph *local_190;
  undefined8 local_188;
  ComputationGraph *local_180;
  undefined8 local_178;
  ComputationGraph *local_170;
  undefined8 local_168;
  ComputationGraph *local_160;
  undefined8 local_158;
  ComputationGraph *local_150;
  undefined8 local_148;
  ComputationGraph *local_140;
  undefined8 local_138;
  ComputationGraph *local_130;
  undefined8 local_128;
  ComputationGraph *local_120;
  VariableIndex local_118;
  uint uStack_114;
  ComputationGraph *local_110;
  FastLSTMBuilder *local_108;
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *local_100;
  Expression local_f8;
  ComputationGraph *local_e8;
  undefined8 local_e0;
  ComputationGraph *local_d8;
  undefined8 local_d0;
  ComputationGraph *local_c8;
  undefined8 local_c0;
  ComputationGraph *local_b8;
  undefined8 local_b0;
  ComputationGraph *local_a8;
  undefined8 local_a0;
  ComputationGraph *local_98;
  undefined8 local_90;
  ComputationGraph *local_88;
  undefined8 local_80;
  ComputationGraph *local_78;
  undefined8 local_70;
  Expression local_68;
  Expression local_58;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> local_48;
  
  local_19c = (undefined4)CONCAT71(in_register_00000011,update);
  local_100 = &this->param_vars;
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::clear(local_100);
  if (this->layers != 0) {
    lVar3 = 0;
    uVar2 = 0;
    local_108 = this;
    do {
      pvVar1 = (this->params).
               super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      p.p = (ParameterStorage *)
            **(undefined8 **)
              ((long)&(pvVar1->
                      super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>).
                      _M_impl.super__Vector_impl_data + lVar3);
      if ((char)local_19c == '\0') {
        EVar4 = const_parameter(cg,p);
        _local_118 = EVar4._8_8_;
        local_110 = EVar4.pg;
        EVar4 = const_parameter(cg,*(ParameterStorage **)
                                    (*(long *)((long)&(pvVar1->
                                                  super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                                  )._M_impl.super__Vector_impl_data + lVar3) + 8));
        local_128 = EVar4._8_8_;
        local_120 = EVar4.pg;
        EVar4 = const_parameter(cg,*(ParameterStorage **)
                                    (*(long *)((long)&(pvVar1->
                                                  super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                                  )._M_impl.super__Vector_impl_data + lVar3) + 0x10)
                               );
        local_138 = EVar4._8_8_;
        local_130 = EVar4.pg;
        EVar4 = const_parameter(cg,*(ParameterStorage **)
                                    (*(long *)((long)&(pvVar1->
                                                  super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                                  )._M_impl.super__Vector_impl_data + lVar3) + 0x18)
                               );
        local_148 = EVar4._8_8_;
        local_140 = EVar4.pg;
        EVar4 = const_parameter(cg,*(ParameterStorage **)
                                    (*(long *)((long)&(pvVar1->
                                                  super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                                  )._M_impl.super__Vector_impl_data + lVar3) + 0x20)
                               );
        local_158 = EVar4._8_8_;
        local_150 = EVar4.pg;
        EVar4 = const_parameter(cg,*(ParameterStorage **)
                                    (*(long *)((long)&(pvVar1->
                                                  super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                                  )._M_impl.super__Vector_impl_data + lVar3) + 0x28)
                               );
        local_168 = EVar4._8_8_;
        local_160 = EVar4.pg;
        EVar4 = const_parameter(cg,*(ParameterStorage **)
                                    (*(long *)((long)&(pvVar1->
                                                  super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                                  )._M_impl.super__Vector_impl_data + lVar3) + 0x30)
                               );
        local_178 = EVar4._8_8_;
        local_170 = EVar4.pg;
        EVar4 = const_parameter(cg,*(ParameterStorage **)
                                    (*(long *)((long)&(pvVar1->
                                                  super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                                  )._M_impl.super__Vector_impl_data + lVar3) + 0x38)
                               );
        local_188 = EVar4._8_8_;
        local_180 = EVar4.pg;
        EVar4 = const_parameter(cg,*(ParameterStorage **)
                                    (*(long *)((long)&(pvVar1->
                                                  super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                                  )._M_impl.super__Vector_impl_data + lVar3) + 0x40)
                               );
        local_198 = EVar4._8_8_;
        local_190 = EVar4.pg;
        EVar4 = const_parameter(cg,*(ParameterStorage **)
                                    (*(long *)((long)&(pvVar1->
                                                  super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                                  )._M_impl.super__Vector_impl_data + lVar3) + 0x48)
                               );
        local_58 = const_parameter(cg,*(ParameterStorage **)
                                       (*(long *)((long)&(pvVar1->
                                                  super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                                  )._M_impl.super__Vector_impl_data + lVar3) + 0x50)
                                  );
      }
      else {
        EVar4 = parameter(cg,p);
        _local_118 = EVar4._8_8_;
        local_110 = EVar4.pg;
        EVar4 = parameter(cg,*(ParameterStorage **)
                              (*(long *)((long)&(pvVar1->
                                                super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                                )._M_impl.super__Vector_impl_data + lVar3) + 8));
        local_128 = EVar4._8_8_;
        local_120 = EVar4.pg;
        EVar4 = parameter(cg,*(ParameterStorage **)
                              (*(long *)((long)&(pvVar1->
                                                super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                                )._M_impl.super__Vector_impl_data + lVar3) + 0x10));
        local_138 = EVar4._8_8_;
        local_130 = EVar4.pg;
        EVar4 = parameter(cg,*(ParameterStorage **)
                              (*(long *)((long)&(pvVar1->
                                                super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                                )._M_impl.super__Vector_impl_data + lVar3) + 0x18));
        local_148 = EVar4._8_8_;
        local_140 = EVar4.pg;
        EVar4 = parameter(cg,*(ParameterStorage **)
                              (*(long *)((long)&(pvVar1->
                                                super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                                )._M_impl.super__Vector_impl_data + lVar3) + 0x20));
        local_158 = EVar4._8_8_;
        local_150 = EVar4.pg;
        EVar4 = parameter(cg,*(ParameterStorage **)
                              (*(long *)((long)&(pvVar1->
                                                super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                                )._M_impl.super__Vector_impl_data + lVar3) + 0x28));
        local_168 = EVar4._8_8_;
        local_160 = EVar4.pg;
        EVar4 = parameter(cg,*(ParameterStorage **)
                              (*(long *)((long)&(pvVar1->
                                                super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                                )._M_impl.super__Vector_impl_data + lVar3) + 0x30));
        local_178 = EVar4._8_8_;
        local_170 = EVar4.pg;
        EVar4 = parameter(cg,*(ParameterStorage **)
                              (*(long *)((long)&(pvVar1->
                                                super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                                )._M_impl.super__Vector_impl_data + lVar3) + 0x38));
        local_188 = EVar4._8_8_;
        local_180 = EVar4.pg;
        EVar4 = parameter(cg,*(ParameterStorage **)
                              (*(long *)((long)&(pvVar1->
                                                super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                                )._M_impl.super__Vector_impl_data + lVar3) + 0x40));
        local_198 = EVar4._8_8_;
        local_190 = EVar4.pg;
        EVar4 = parameter(cg,*(ParameterStorage **)
                              (*(long *)((long)&(pvVar1->
                                                super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                                )._M_impl.super__Vector_impl_data + lVar3) + 0x48));
        local_58 = parameter(cg,*(ParameterStorage **)
                                 (*(long *)((long)&(pvVar1->
                                                  super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                                  )._M_impl.super__Vector_impl_data + lVar3) + 0x50)
                            );
      }
      local_f8.pg = local_110;
      local_f8.i = local_118;
      local_f8.graph_id = uStack_114;
      local_e8 = local_120;
      local_e0 = local_128;
      local_d8 = local_130;
      local_d0 = local_138;
      local_c8 = local_140;
      local_c0 = local_148;
      local_b8 = local_150;
      local_b0 = local_158;
      local_a8 = local_160;
      local_a0 = local_168;
      local_98 = local_170;
      local_90 = local_178;
      local_88 = local_180;
      local_80 = local_188;
      local_78 = local_190;
      local_70 = local_198;
      __l._M_len = 0xb;
      __l._M_array = &local_f8;
      local_68 = EVar4;
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
                (&local_48,__l,&local_19d);
      std::
      vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
      ::push_back(local_100,&local_48);
      this = local_108;
      if (local_48.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x18;
    } while (uVar2 < this->layers);
  }
  return;
}

Assistant:

void FastLSTMBuilder::new_graph_impl(ComputationGraph& cg, bool update){
  param_vars.clear();

  for (unsigned i = 0; i < layers; ++i){
    auto& p = params[i];

    //i
    Expression i_x2i = update ? parameter(cg,p[X2I]) : const_parameter(cg,p[X2I]);
    Expression i_h2i = update ? parameter(cg,p[H2I]) : const_parameter(cg,p[H2I]);
    Expression i_c2i = update ? parameter(cg,p[C2I]) : const_parameter(cg,p[C2I]);
    Expression i_bi = update ? parameter(cg,p[BI]) : const_parameter(cg,p[BI]);
    //o
    Expression i_x2o = update ? parameter(cg,p[X2O]) : const_parameter(cg,p[X2O]);
    Expression i_h2o = update ? parameter(cg,p[H2O]) : const_parameter(cg,p[H2O]);
    Expression i_c2o = update ? parameter(cg,p[C2O]) : const_parameter(cg,p[C2O]);
    Expression i_bo = update ? parameter(cg,p[BO]) : const_parameter(cg,p[BO]);
    //c
    Expression i_x2c = update ? parameter(cg,p[X2C]) : const_parameter(cg,p[X2C]);
    Expression i_h2c = update ? parameter(cg,p[H2C]) : const_parameter(cg,p[H2C]);
    Expression i_bc = update ? parameter(cg,p[BC]) : const_parameter(cg,p[BC]);

    vector<Expression> vars = {i_x2i, i_h2i, i_c2i, i_bi, i_x2o, i_h2o, i_c2o, i_bo, i_x2c, i_h2c, i_bc};
    param_vars.push_back(vars);
  }
}